

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O3

void bench_sign_setup(void *arg)

{
  *(undefined8 *)((long)arg + 8) = 0x807060504030201;
  *(undefined8 *)((long)arg + 0x10) = 0x100f0e0d0c0b0a09;
  *(undefined8 *)((long)arg + 0x18) = 0x1817161514131211;
  *(undefined8 *)((long)arg + 0x20) = 0x201f1e1d1c1b1a19;
  *(undefined8 *)((long)arg + 0x28) = 0x4847464544434241;
  *(undefined8 *)((long)arg + 0x30) = 0x504f4e4d4c4b4a49;
  *(undefined8 *)((long)arg + 0x38) = 0x5857565554535251;
  *(undefined8 *)((long)arg + 0x40) = 0x605f5e5d5c5b5a59;
  return;
}

Assistant:

static void bench_sign_setup(void* arg) {
    int i;
    bench_data *data = (bench_data*)arg;

    for (i = 0; i < 32; i++) {
        data->msg[i] = i + 1;
    }
    for (i = 0; i < 32; i++) {
        data->key[i] = i + 65;
    }
}